

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O3

index_type __thiscall
anon_unknown.dwarf_a2ad01::TransformSelectorIndexes::NormalizeIndex
          (TransformSelectorIndexes *this,index_type index,size_t count)

{
  runtime_error *this_00;
  index_type index_local;
  size_t count_local;
  unsigned_long local_48;
  string local_40;
  
  index_local = index;
  if (index < 0) {
    index_local = index + count;
  }
  if ((-1 < index_local) && ((ulong)index_local < count)) {
    return index_local;
  }
  count_local = count;
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48 = count - 1;
  cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>
            (&local_40,(char (*) [33])"sub-command TRANSFORM, selector ",
             &(this->super_TransformSelector).Tag,(char (*) [10])", index: ",&index_local,
             (char (*) [17])" out of range (-",&count_local,(char (*) [3])0x8af221,&local_48,
             (char (*) [3])0x8953cb);
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00b19ff8;
  __cxa_throw(this_00,&cmList::transform_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

index_type NormalizeIndex(index_type index, std::size_t count)
  {
    if (index < 0) {
      index = static_cast<index_type>(count) + index;
    }
    if (index < 0 || count <= static_cast<std::size_t>(index)) {
      throw transform_error(cmStrCat(
        "sub-command TRANSFORM, selector ", this->Tag, ", index: ", index,
        " out of range (-", count, ", ", count - 1, ")."));
    }
    return index;
  }